

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yymatchString(GREG *G,char *s)

{
  int iVar1;
  int iVar2;
  char *pcStack_20;
  int yysav;
  char *s_local;
  GREG *G_local;
  
  iVar1 = G->pos;
  pcStack_20 = s;
  while( true ) {
    if (*pcStack_20 == '\0') {
      return 1;
    }
    if ((G->limit <= G->pos) && (iVar2 = yyrefill(G), iVar2 == 0)) break;
    if (G->buf[G->pos] != *pcStack_20) {
      G->pos = iVar1;
      return 0;
    }
    pcStack_20 = pcStack_20 + 1;
    G->pos = G->pos + 1;
  }
  return 0;
}

Assistant:

YY_LOCAL(int) yymatchString(GREG *G, const char *s)
{
  int yysav= G->pos;
  while (*s)
    {
      if (G->pos >= G->limit && !yyrefill(G)) return 0;
      if (G->buf[G->pos] != *s)
        {
          G->pos= yysav;
          return 0;
        }
      ++s;
      ++G->pos;
    }
  return 1;
}